

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* testing::StrEq<char[10]>
            (PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,StringLike<char[10]> *str)

{
  StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *impl;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  StringLike<char[10]> *local_18;
  StringLike<char[10]> *str_local;
  
  local_18 = str;
  str_local = (StringLike<char[10]> *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,*str,&local_61);
  internal::
  StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::StrEqualityMatcher(&local_40,&local_60,true,true);
  MakePolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::string>>
            (__return_storage_ptr__,(testing *)&local_40,impl);
  internal::
  StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~StrEqualityMatcher(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return __return_storage_ptr__;
}

Assistant:

PolymorphicMatcher<internal::StrEqualityMatcher<std::string> > StrEq(
    const internal::StringLike<T>& str) {
  return MakePolymorphicMatcher(
      internal::StrEqualityMatcher<std::string>(std::string(str), true, true));
}